

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O1

void djb::spline::uwrap_repeat(float_t u,int s,int *x,int *y,float_t *w)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  float fVar5;
  float_t intpart;
  float local_2c;
  
  fVar5 = modff(u * (float)s,&local_2c);
  iVar2 = (int)local_2c;
  iVar1 = 0;
  if (0 < iVar2) {
    iVar1 = iVar2;
  }
  uVar3 = s + (uint)(s == 0);
  iVar1 = (((uint)(((iVar2 >> 0x1f) - iVar2) + iVar1) / uVar3 - (iVar2 >> 0x1f)) + 1) * s + iVar2;
  do {
    iVar1 = iVar1 - s;
  } while (s <= iVar1);
  *x = iVar1;
  iVar4 = (uint)(0.0 < fVar5) - (uint)(fVar5 < 0.0);
  iVar2 = iVar2 + iVar4;
  iVar1 = 0;
  if (0 < iVar2) {
    iVar1 = iVar2;
  }
  iVar2 = (((uint)(((iVar2 >> 0x1f) - iVar2) + iVar1) / uVar3 - (iVar2 >> 0x1f)) + 1) * s + iVar2;
  do {
    iVar2 = iVar2 - s;
  } while (s <= iVar2);
  *y = iVar2;
  *w = fVar5 * (float)iVar4;
  return;
}

Assistant:

void uwrap_repeat(float_t u, int s, int *x, int *y, float_t *w)
{
	float_t intpart; float_t frac = modf(u * s, &intpart);
	(*x) = iwrap_repeat((int)intpart            , s);
	(*y) = iwrap_repeat((int)intpart + sgn(frac), s);
	(*w) = frac * sgn(frac);
}